

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
OnDiskIndex::read_run_offsets
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          OnDiskIndex *this)

{
  __off_t in_R8;
  allocator_type local_11;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,0x1000001,&local_11);
  RawFile::pread(&this->ndxfile,
                 (int)(__return_storage_ptr__->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_start,(void *)0x8000008,
                 this->index_size - 0x8000008,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint64_t> OnDiskIndex::read_run_offsets() const {
    std::vector<uint64_t> run_offsets(NUM_TRIGRAMS + 1);
    ndxfile.pread(run_offsets.data(), RUN_ARRAY_SIZE,
                  index_size - RUN_ARRAY_SIZE);
    return run_offsets;
}